

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O1

int sx_hashtbltval_find(sx_hashtbl_tval *tbl,uint32_t key)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  bool bVar9;
  
  bVar1 = (byte)tbl->_bitshift;
  uVar5 = (ulong)(key >> (bVar1 & 0x3f) ^ key) * -0x61c8864680b583eb >> (bVar1 & 0x3f);
  iVar3 = (int)uVar5;
  if (tbl->keys[uVar5 & 0xffffffff] != key) {
    uVar2 = tbl->capacity;
    tbl->_miss_cnt = tbl->_miss_cnt + 1;
    if (1 < uVar2) {
      iVar7 = tbl->_probe_cnt;
      iVar8 = uVar2 - 1;
      uVar4 = iVar3 + 1;
      uVar5 = (ulong)uVar4;
      do {
        iVar7 = iVar7 + 1;
        tbl->_probe_cnt = iVar7;
        bVar9 = tbl->keys[(int)((ulong)uVar4 % (ulong)uVar2)] == key;
        uVar6 = (ulong)uVar4 % (ulong)uVar2;
        if (!bVar9) {
          uVar6 = uVar5;
        }
        if (bVar9) {
          return (int)uVar6;
        }
        uVar4 = uVar4 + 1;
        iVar8 = iVar8 + -1;
        uVar5 = uVar6;
      } while (iVar8 != 0);
    }
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

int sx_hashtbltval_find(const sx_hashtbl_tval* tbl, uint32_t key)
{
    uint32_t h = sx__fib_hash(key, tbl->_bitshift);
    uint32_t cnt = (uint32_t)tbl->capacity;
    if (tbl->keys[h] == key) {
        return h;
    } else {
#if SX_CONFIG_HASHTBL_DEBUG
        sx_hashtbl_tval* _tbl = (sx_hashtbl_tval*)tbl;
        ++_tbl->_miss_cnt;
#endif
        // probe lineary in the keys array
        for (uint32_t i = 1; i < cnt; i++) {
            int idx = (h + i) % cnt;
#if SX_CONFIG_HASHTBL_DEBUG
            ++_tbl->_probe_cnt;
#endif
            if (tbl->keys[idx] == key)
                return idx;
        }

        return -1;    // Worst case: Not found!
    }
}